

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2.hpp
# Opt level: O0

int crypto::pbkdf2<crypto::iterated_hash<crypto::sha256_transform>_>::derive
              (EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  size_t __n;
  long extraout_RAX;
  unsigned_long *puVar1;
  long lVar2;
  char *in_R8;
  void *in_R9;
  unsigned_long in_stack_00000008;
  size_t n;
  size_t j;
  hmac_t mac_1;
  size_t i;
  char f [32];
  hmac_t mac;
  char b [4];
  char u [32];
  size_t block;
  state_t ostate;
  state_t istate;
  char *in_stack_fffffffffffffe38;
  hmac<crypto::iterated_hash<crypto::sha256_transform>_> *in_stack_fffffffffffffe40;
  ulong local_1b0;
  hmac<crypto::iterated_hash<crypto::sha256_transform>_> local_1a8;
  char *in_stack_fffffffffffffec0;
  hash_word *in_stack_fffffffffffffec8;
  hmac<crypto::iterated_hash<crypto::sha256_transform>_> *in_stack_fffffffffffffed0;
  hash_word *in_stack_ffffffffffffff28;
  hash_word *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  hash_word *local_a8;
  hmac<crypto::iterated_hash<crypto::sha256_transform>_> *local_a0;
  long local_80;
  EVP_PKEY_CTX local_58 [40];
  void *local_30;
  char *local_28;
  size_t *local_18;
  uchar *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = keylen;
  local_10 = key;
  local_8 = ctx;
  hmac<crypto::iterated_hash<crypto::sha256_transform>_>::prepare_state
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  local_80 = 1;
  lVar2 = extraout_RAX;
  for (; in_stack_00000008 != 0; in_stack_00000008 = in_stack_00000008 - __n) {
    hmac<crypto::iterated_hash<crypto::sha256_transform>_>::init
              ((hmac<crypto::iterated_hash<crypto::sha256_transform>_> *)&stack0xfffffffffffffeec,
               local_58);
    hmac<crypto::iterated_hash<crypto::sha256_transform>_>::update
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,0x17b499);
    hmac<crypto::iterated_hash<crypto::sha256_transform>_>::update
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,0x17b4b3);
    hmac<crypto::iterated_hash<crypto::sha256_transform>_>::finalize
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    in_stack_fffffffffffffec8 = local_a8;
    in_stack_fffffffffffffed0 = local_a0;
    for (in_stack_fffffffffffffec0 = (char *)0x1; in_stack_fffffffffffffec0 < local_28;
        in_stack_fffffffffffffec0 = in_stack_fffffffffffffec0 + 1) {
      hmac<crypto::iterated_hash<crypto::sha256_transform>_>::init(&local_1a8,local_58);
      hmac<crypto::iterated_hash<crypto::sha256_transform>_>::update
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,0x17b55b);
      hmac<crypto::iterated_hash<crypto::sha256_transform>_>::finalize
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      for (local_1b0 = 0; local_1b0 < 0x20; local_1b0 = local_1b0 + 1) {
        (&stack0xfffffffffffffec8)[local_1b0] =
             (&stack0xfffffffffffffec8)[local_1b0] ^ *(byte *)((long)&local_a8 + local_1b0);
      }
    }
    in_stack_fffffffffffffe40 = (hmac<crypto::iterated_hash<crypto::sha256_transform>_> *)0x20;
    puVar1 = std::min<unsigned_long>((unsigned_long *)&stack0xfffffffffffffe40,&stack0x00000008);
    __n = *puVar1;
    memcpy(local_30,&stack0xfffffffffffffec8,__n);
    local_30 = (void *)(__n + (long)local_30);
    lVar2 = local_80 + 1;
    local_80 = lVar2;
  }
  return (int)lVar2;
}

Assistant:

static void derive(const char * password, size_t password_length, const char * salt, size_t salt_length,
	                   size_t iterations, char * key, size_t key_length) {
		
		typename hmac_t::state_t istate, ostate;
		hmac_t::prepare_state(password, password_length, istate, ostate);
		
		for(size_t block = 1; key_length > 0; block++) {
			
			char u[hash_size];
			{
				char b[4] = { char(block >> 24), char(block >> 16), char(block >> 8), char(block) };
				hmac_t mac;
				mac.init(istate);
				mac.update(salt, salt_length);
				mac.update(b, sizeof(b));
				mac.finalize(ostate, u);
			}
			char f[hash_size];
			std::memcpy(f, u, hash_size);
			
			for(size_t i = 1; i < iterations; i++) {
				hmac_t mac;
				mac.init(istate);
				mac.update(u, hash_size);
				mac.finalize(ostate, u);
				for(size_t j = 0; j < hash_size; j++) {
					f[j] = char(boost::uint8_t(f[j]) ^ boost::uint8_t(u[j]));
				}
			}
			
			size_t n = std::min(size_t(hash_size), key_length);
			std::memcpy(key, f, n);
			key += n;
			key_length -= n;
		}
		
	}